

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::Image::GLES2ImageApi::Create::invokeGLES2
          (Create *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *image,Texture2D *ref)

{
  PtrData<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_> data;
  PtrData<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> data_00;
  MovePtr *this_00;
  ImageSource *source;
  ClientBuffer *buffer_00;
  ClientBuffer *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  GLES2ImageApi *pGVar1;
  PtrData<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> local_88;
  UniqueImage *local_78;
  PtrData<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
  local_58;
  PtrData<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
  *local_48;
  undefined1 local_38 [8];
  UniquePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
  buffer;
  Texture2D *ref_local;
  MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *image_local;
  GLES2ImageApi *api_local;
  Create *this_local;
  
  buffer.
  super_UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
  .m_data._8_8_ = ref;
  this_00 = (MovePtr *)
            de::details::
            UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
            ::operator->(&(this->m_imgSource).
                          super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
                        );
  (*(*(_func_int ***)this_00)[3])
            (&local_58,this_00,api->m_gl,
             buffer.
             super_UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
             .m_data._8_8_);
  local_48 = de::details::MovePtr::operator_cast_to_PtrData(&local_58,this_00);
  data._8_8_ = in_stack_ffffffffffffff50;
  data.ptr = in_stack_ffffffffffffff48;
  de::details::
  UniquePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>::
  UniquePtr((UniquePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
             *)local_38,data);
  de::details::
  MovePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>::
  ~MovePtr((MovePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
            *)&local_58);
  source = de::details::
           UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           ::operator*(&(this->m_imgSource).
                        super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
                      );
  buffer_00 = de::details::
              UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
              ::operator*((UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
                           *)local_38);
  pGVar1 = api;
  createImage((MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *)&local_88,api,
              source,buffer_00);
  local_78 = (UniqueImage *)de::details::MovePtr::operator_cast_to_PtrData(&local_88,(MovePtr *)api)
  ;
  data_00._8_8_ = pGVar1;
  data_00.ptr = local_78;
  de::details::MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::operator=
            (image,data_00);
  de::details::MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::~MovePtr
            ((MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *)&local_88);
  de::details::
  UniquePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>::
  ~UniquePtr((UniquePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
              *)local_38);
  return true;
}

Assistant:

bool GLES2ImageApi::Create::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& image, tcu::Texture2D& ref) const
{
	de::UniquePtr<ClientBuffer>	buffer	(m_imgSource->createBuffer(api.m_gl, &ref));
	image = api.createImage(*m_imgSource, *buffer);
	return true;
}